

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::SetColumnOffset(int column_index,float offset)

{
  ImGuiOldColumnData *pIVar1;
  ImGuiOldColumns *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImGuiOldColumnData *pIVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  
  while( true ) {
    pIVar4 = GImGui;
    pIVar2 = (GImGui->CurrentWindow->DC).CurrentColumns;
    if (column_index < 0) {
      column_index = pIVar2->Current;
    }
    if ((pIVar2->Flags & 4U) == 0) {
      bVar3 = column_index < pIVar2->Count + -1;
    }
    else {
      bVar3 = false;
    }
    fVar8 = 0.0;
    if (bVar3) {
      iVar5 = column_index;
      if (column_index < 0) {
        iVar5 = pIVar2->Current;
      }
      pIVar6 = (pIVar2->Columns).Data;
      pIVar1 = pIVar6 + iVar5;
      pIVar6 = (ImGuiOldColumnData *)&pIVar6[iVar5].OffsetNormBeforeResize;
      if (pIVar2->IsBeingResized == false) {
        pIVar6 = pIVar1;
      }
      fVar8 = (pIVar2->OffMaxX - pIVar2->OffMinX) *
              ((&pIVar1[1].OffsetNorm)[pIVar2->IsBeingResized] - pIVar6->OffsetNorm);
    }
    if (((pIVar2->Flags & 8U) == 0) &&
       (fVar9 = pIVar2->OffMaxX -
                (float)(pIVar2->Count - column_index) * (GImGui->Style).ColumnsMinSpacing,
       fVar9 <= offset)) {
      offset = fVar9;
    }
    (pIVar2->Columns).Data[column_index].OffsetNorm =
         (offset - pIVar2->OffMinX) / (pIVar2->OffMaxX - pIVar2->OffMinX);
    if (!bVar3) break;
    column_index = column_index + 1;
    fVar9 = (pIVar4->Style).ColumnsMinSpacing;
    uVar7 = -(uint)(fVar8 <= fVar9);
    offset = offset + (float)(~uVar7 & (uint)fVar8 | (uint)fVar9 & uVar7);
  }
  return;
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiOldColumnFlags_NoPreserveWidths) && (column_index < columns->Count - 1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiOldColumnFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}